

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDec.c
# Opt level: O1

void Abc_TruthDecTest(char *pFileName,int DecType,int nVarNum,int fVerbose)

{
  Abc_TtStore_t *p;
  
  p = Abc_TtStoreLoad(pFileName,nVarNum);
  if (p != (Abc_TtStore_t *)0x0) {
    Abc_TruthDecPerform(p,DecType,fVerbose);
    Abc_TtStoreFree(p,nVarNum);
    return;
  }
  return;
}

Assistant:

void Abc_TruthDecTest( char * pFileName, int DecType, int nVarNum, int fVerbose )
{
    Abc_TtStore_t * p;

    // allocate data-structure
    p = Abc_TtStoreLoad( pFileName, nVarNum );
    if ( p == NULL ) return;

    // consider functions from the file
    Abc_TruthDecPerform( p, DecType, fVerbose );

    // delete data-structure
    Abc_TtStoreFree( p, nVarNum );
//    printf( "Finished decomposing truth tables from file \"%s\".\n", pFileName );
}